

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.h
# Opt level: O2

float half_to_float(uint16_t hv)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  float fVar4;
  
  uVar2 = (hv & 0x7fff) << 0xd;
  fVar4 = (float)((hv & 0x8000) << 0x10);
  if (uVar2 < 0x800000) {
    if ((hv & 0x7fff) != 0) {
      uVar1 = 0x1f;
      if ((hv & 0x7fff) != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar3 = (uVar1 ^ 0x1f) - 8;
      fVar4 = (float)(((uint)fVar4 | uVar2 << ((byte)iVar3 & 0x1f) | 0x38800000) + iVar3 * -0x800000
                     );
    }
  }
  else if (uVar2 < 0xf800000) {
    fVar4 = (float)(((uint)fVar4 | uVar2) + 0x38000000);
  }
  else {
    fVar4 = (float)((uint)fVar4 | uVar2 | 0x7f800000);
  }
  return fVar4;
}

Assistant:

static inline float
imath_half_to_float (imath_half_bits_t h)
{
#if defined(__F16C__)
    // NB: The intel implementation does seem to treat NaN slightly
    // different than the original toFloat table does (i.e. where the
    // 1 bits are, meaning the signalling or not bits). This seems
    // benign, given that the original library didn't really deal with
    // signalling vs non-signalling NaNs
#    ifdef _MSC_VER
    /* msvc does not seem to have cvtsh_ss :( */
    return _mm_cvtss_f32 (_mm_cvtph_ps (_mm_set1_epi16 (h)));
#    else
    return _cvtsh_ss (h);
#    endif
#elif defined(IMATH_HALF_USE_LOOKUP_TABLE) &&                                  \
    !defined(IMATH_HALF_NO_LOOKUP_TABLE)
    return imath_half_to_float_table[h].f;
#else
    imath_half_uif_t v;
    // this code would be clearer, although it does appear to be faster
    // (1.06 vs 1.08 ns/call) to avoid the constants and just do 4
    // shifts.
    //
    uint32_t hexpmant = ((uint32_t) (h) << 17) >> 4;
    v.i               = ((uint32_t) (h >> 15)) << 31;

    // the likely really does help if most of your numbers are "normal" half numbers
    if (IMATH_LIKELY ((hexpmant >= 0x00800000)))
    {
        v.i |= hexpmant;
        // either we are a normal number, in which case add in the bias difference
        // otherwise make sure all exponent bits are set
        if (IMATH_LIKELY ((hexpmant < 0x0f800000)))
            v.i += 0x38000000;
        else
            v.i |= 0x7f800000;
    }
    else if (hexpmant != 0)
    {
        // exponent is 0 because we're denormal, don't have to extract
        // the mantissa, can just use as is
        //
        //
        // other compilers may provide count-leading-zeros primitives,
        // but we need the community to inform us of the variants
        uint32_t lc;
#    if defined(_MSC_VER)
        // The direct intrinsic for this is __lznct, but that is not supported
        // on older x86_64 hardware or ARM. Instead uses the bsr instruction
        // and one additional subtraction. This assumes hexpmant != 0, for 0
        // bsr and lznct would behave differently.
        unsigned long bsr;
        _BitScanReverse (&bsr, hexpmant);
        lc = (31 - bsr);
#    elif defined(__GNUC__) || defined(__clang__)
        lc = (uint32_t) __builtin_clz (hexpmant);
#    else
        lc = 0;
        while (0 == ((hexpmant << lc) & 0x80000000))
            ++lc;
#    endif
        lc -= 8;
        // so nominally we want to remove that extra bit we shifted
        // up, but we are going to add that bit back in, then subtract
        // from it with the 0x38800000 - (lc << 23)....
        //
        // by combining, this allows us to skip the & operation (and
        // remove a constant)
        //
        // hexpmant &= ~0x00800000;
        v.i |= 0x38800000;
        // lc is now x, where the desired exponent is then
        // -14 - lc
        // + 127 -> new exponent
        v.i |= (hexpmant << lc);
        v.i -= (lc << 23);
    }
    return v.f;
#endif
}